

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  BYTE *iend;
  long lVar1;
  ZSTD_matchState_t *ms;
  seqStore_t *origSeqStore;
  undefined8 uVar2;
  undefined8 uVar3;
  BYTE BVar4;
  ZSTD_strategy ZVar5;
  BYTE *pBVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  unsigned_long_long uVar8;
  U32 UVar9;
  short sVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  U32 lastBlock;
  size_t err_code_1;
  ulong uVar14;
  BYTE *pBVar15;
  size_t sVar16;
  ulong uVar17;
  size_t sVar18;
  byte bVar19;
  ushort uVar20;
  long lVar21;
  size_t sVar22;
  uint uVar23;
  size_t err_code_7;
  long lVar24;
  short *dst_00;
  seqStore_t *psVar25;
  seqStore_t *psVar26;
  ulong dstCapacity_00;
  size_t err_code;
  ulong uVar27;
  seqDef *psVar28;
  BYTE *op;
  bool bVar29;
  byte bVar30;
  undefined1 auVar31 [16];
  size_t local_488;
  BYTE *ip;
  repcodes_t dRep;
  repcodes_t local_440;
  int local_430;
  U32 local_42c;
  size_t local_428;
  ulong local_420;
  long local_418;
  seqDef *local_410;
  size_t local_408;
  short *local_400;
  ZSTD_CCtx_params *local_3f8;
  ZSTD_cwksp *local_3f0;
  seqStore_t currSeqStore;
  seqStore_t nextSeqStore;
  U32 partitions [196];
  
  bVar30 = 0;
  if (cctx->stage == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  if (cctx->stage == ZSTDcs_init && frame != 0) {
    local_408 = ZSTD_writeFrameHeader
                          (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                           cctx->dictID);
    if (0xffffffffffffff88 < local_408) {
      return local_408;
    }
    local_488 = dstCapacity - local_408;
    dst = (void *)((long)dst + local_408);
    cctx->stage = ZSTDcs_ongoing;
  }
  else {
    local_408 = 0;
    local_488 = dstCapacity;
  }
  if (srcSize == 0) {
    return local_408;
  }
  ms = &(cctx->blockState).matchState;
  pBVar6 = (cctx->blockState).matchState.window.nextSrc;
  bVar29 = (cctx->blockState).matchState.forceNonContiguous == 0;
  if (bVar29 && pBVar6 == (BYTE *)src) {
    pBVar15 = (cctx->blockState).matchState.window.dictBase;
    uVar23 = (cctx->blockState).matchState.window.lowLimit;
    uVar14 = (ulong)(cctx->blockState).matchState.window.dictLimit;
  }
  else {
    pBVar15 = (cctx->blockState).matchState.window.base;
    uVar14 = (long)pBVar6 - (long)pBVar15;
    uVar23 = (cctx->blockState).matchState.window.dictLimit;
    (cctx->blockState).matchState.window.lowLimit = uVar23;
    uVar12 = (uint)uVar14;
    (cctx->blockState).matchState.window.dictLimit = uVar12;
    (cctx->blockState).matchState.window.dictBase = pBVar15;
    (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar14);
    if (uVar12 - uVar23 < 8) {
      (cctx->blockState).matchState.window.lowLimit = uVar12;
      uVar23 = uVar12;
    }
  }
  iend = (BYTE *)((long)src + srcSize);
  (ms->window).nextSrc = iend;
  if ((pBVar15 + uVar23 < iend) && (src < pBVar15 + (uVar14 & 0xffffffff))) {
    UVar9 = (U32)((long)iend - (long)pBVar15);
    if ((long)(uVar14 & 0xffffffff) < (long)iend - (long)pBVar15) {
      UVar9 = (U32)uVar14;
    }
    (cctx->blockState).matchState.window.lowLimit = UVar9;
  }
  if (!bVar29 || pBVar6 != (BYTE *)src) {
    (cctx->blockState).matchState.forceNonContiguous = 0;
    (cctx->blockState).matchState.nextToUpdate = (U32)uVar14;
  }
  if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
    pBVar6 = (cctx->ldmState).window.nextSrc;
    if (pBVar6 == (BYTE *)src) {
      pBVar15 = (cctx->ldmState).window.dictBase;
      uVar23 = (cctx->ldmState).window.lowLimit;
      uVar14 = (ulong)(cctx->ldmState).window.dictLimit;
    }
    else {
      pBVar15 = (cctx->ldmState).window.base;
      uVar14 = (long)pBVar6 - (long)pBVar15;
      uVar23 = (cctx->ldmState).window.dictLimit;
      (cctx->ldmState).window.lowLimit = uVar23;
      uVar12 = (uint)uVar14;
      (cctx->ldmState).window.dictLimit = uVar12;
      (cctx->ldmState).window.dictBase = pBVar15;
      (cctx->ldmState).window.base = (BYTE *)((long)src - uVar14);
      if (uVar12 - uVar23 < 8) {
        (cctx->ldmState).window.lowLimit = uVar12;
        uVar23 = uVar12;
      }
    }
    (cctx->ldmState).window.nextSrc = iend;
    if ((pBVar15 + uVar23 < iend) && (src < pBVar15 + (uVar14 & 0xffffffff))) {
      UVar9 = (U32)((long)iend - (long)pBVar15);
      if ((long)(uVar14 & 0xffffffff) < (long)iend - (long)pBVar15) {
        UVar9 = (U32)uVar14;
      }
      (cctx->ldmState).window.lowLimit = UVar9;
    }
  }
  local_3f8 = &cctx->appliedParams;
  if (frame == 0) {
    ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,local_3f8,src,iend);
    uVar14 = ZSTD_compressBlock_internal(cctx,dst,local_488,src,srcSize,0);
  }
  else {
    local_430 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
    uVar14 = cctx->blockSize;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_42c = lastFrameChunk & 1;
    local_3f0 = &cctx->workspace;
    origSeqStore = &cctx->seqStore;
    sVar22 = srcSize;
    ip = (BYTE *)src;
    local_400 = (short *)dst;
    do {
      UVar9 = local_42c;
      if (uVar14 < srcSize) {
        UVar9 = 0;
      }
      if (local_488 < 6) {
        return 0xffffffffffffffba;
      }
      if (srcSize < uVar14) {
        uVar14 = srcSize;
      }
      pBVar6 = ip + uVar14;
      ZSTD_overflowCorrectIfNeeded(ms,local_3f0,local_3f8,ip,pBVar6);
      if ((cctx->blockState).matchState.loadedDictEnd + local_430 <
          (uint)((int)pBVar6 - *(int *)&(cctx->blockState).matchState.window.base)) {
        (cctx->blockState).matchState.loadedDictEnd = 0;
        (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
      }
      uVar23 = (cctx->blockState).matchState.window.lowLimit;
      if ((cctx->blockState).matchState.nextToUpdate < uVar23) {
        (cctx->blockState).matchState.nextToUpdate = uVar23;
      }
      sVar10 = (short)uVar14;
      uVar11 = (ushort)UVar9;
      if ((cctx->appliedParams).targetCBlockSize == 0) {
        if ((cctx->appliedParams).splitBlocks == 0) {
          sVar16 = ZSTD_compressBlock_internal
                             (cctx,(void *)((long)dst + 3),local_488 - 3,ip,uVar14,1);
          if (0xffffffffffffff88 < sVar16) {
            return sVar16;
          }
          if (sVar16 == 1) {
            uVar20 = 2;
            sVar18 = uVar14;
          }
          else {
            if (sVar16 == 0) {
              if (local_488 < uVar14 + 3) {
                return 0xffffffffffffffba;
              }
              *(ushort *)dst = uVar11 + sVar10 * 8;
              *(char *)((long)dst + 2) = (char)(uVar14 >> 0xd);
              goto LAB_0068f3c5;
            }
            uVar20 = 4;
            sVar18 = sVar16;
          }
          *(ushort *)dst = (uVar20 | uVar11) + (short)sVar18 * 8;
          *(char *)((long)dst + 2) = (char)(sVar18 >> 0xd);
          uVar17 = sVar16 + 3;
        }
        else {
          sVar16 = ZSTD_buildSeqStore(cctx,ip,uVar14);
          if (0xffffffffffffff88 < sVar16) {
            return sVar16;
          }
          if (sVar16 == 1) {
            pZVar7 = (cctx->blockState).prevCBlock;
            if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            if (local_488 < uVar14 + 3) {
              return 0xffffffffffffffba;
            }
            *(ushort *)dst = uVar11 + sVar10 * 8;
            *(char *)((long)dst + 2) = (char)(uVar14 >> 0xd);
LAB_0068f3c5:
            uVar17 = uVar14 + 3;
            memcpy((void *)((long)dst + 3),ip,uVar14);
          }
          else {
            uVar17 = (ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3;
            nextSeqStore.sequencesStart = (seqDef *)partitions;
            nextSeqStore.sequences = (seqDef *)0x0;
            uVar23 = (uint)uVar17;
            if (uVar23 < 5) {
              pZVar7 = (cctx->blockState).prevCBlock;
              dRep.rep[2] = pZVar7->rep[2];
              dRep.rep._0_8_ = *(undefined8 *)pZVar7->rep;
              local_440.rep._0_8_ = *(undefined8 *)pZVar7->rep;
              local_440.rep[2] = pZVar7->rep[2];
            }
            else {
              ZSTD_deriveBlockSplitsHelper
                        ((seqStoreSplits *)&nextSeqStore,0,uVar17 & 0xffffffff,cctx,origSeqStore);
              (&(nextSeqStore.sequencesStart)->offset)[(long)nextSeqStore.sequences] = uVar23;
              pZVar7 = (cctx->blockState).prevCBlock;
              dRep.rep[2] = pZVar7->rep[2];
              dRep.rep._0_8_ = *(undefined8 *)pZVar7->rep;
              local_440.rep._0_8_ = *(undefined8 *)pZVar7->rep;
              local_440.rep[2] = pZVar7->rep[2];
              local_410 = nextSeqStore.sequences;
              if (nextSeqStore.sequences != (seqDef *)0x0) {
                local_428 = sVar22;
                ZSTD_deriveSeqStoreChunk(&currSeqStore,origSeqStore,0,(ulong)partitions[0]);
                psVar28 = (seqDef *)0x0;
                local_418 = 0;
                dst_00 = (short *)dst;
                dstCapacity_00 = local_488;
                uVar27 = 0;
                local_420 = uVar14;
                do {
                  if ((long)currSeqStore.sequences - (long)currSeqStore.sequencesStart == 0) {
                    sVar16 = 0;
                  }
                  else {
                    lVar21 = (long)currSeqStore.sequences - (long)currSeqStore.sequencesStart >> 3;
                    uVar14 = lVar21 + (ulong)(lVar21 == 0);
                    lVar21 = 0;
                    uVar17 = 0;
                    do {
                      lVar24 = lVar21 + (ulong)currSeqStore.sequencesStart[uVar17].litLength;
                      lVar21 = lVar21 + 0x10000 +
                               (ulong)currSeqStore.sequencesStart[uVar17].litLength;
                      if (currSeqStore.longLengthType != ZSTD_llt_literalLength) {
                        lVar21 = lVar24;
                      }
                      if (currSeqStore.longLengthPos != uVar17) {
                        lVar21 = lVar24;
                      }
                      uVar17 = uVar17 + 1;
                    } while (uVar14 != uVar17);
                    lVar24 = 0;
                    uVar17 = 0;
                    do {
                      lVar1 = lVar24 + 3 + (ulong)currSeqStore.sequencesStart[uVar17].matchLength;
                      lVar24 = lVar24 + 0x10003 +
                               (ulong)currSeqStore.sequencesStart[uVar17].matchLength;
                      if (currSeqStore.longLengthType != ZSTD_llt_matchLength) {
                        lVar24 = lVar1;
                      }
                      if (currSeqStore.longLengthPos != uVar17) {
                        lVar24 = lVar1;
                      }
                      uVar17 = uVar17 + 1;
                    } while (uVar14 != uVar17);
                    sVar16 = lVar24 + lVar21;
                  }
                  local_418 = local_418 + sVar16;
                  if (psVar28 == local_410) {
                    sVar16 = (sVar16 + local_420) - local_418;
                    lastBlock = UVar9;
                  }
                  else {
                    ZSTD_deriveSeqStoreChunk
                              (&nextSeqStore,origSeqStore,(ulong)partitions[(long)psVar28],
                               (ulong)partitions[(long)((long)&psVar28->offset + 1)]);
                    lastBlock = 0;
                  }
                  uVar17 = ZSTD_compressSeqStore_singleBlock
                                     (cctx,&currSeqStore,&dRep,&local_440,dst_00,dstCapacity_00,ip,
                                      sVar16,lastBlock,1);
                  uVar14 = local_420;
                  sVar22 = local_428;
                  if (0xffffffffffffff88 < uVar17) goto LAB_0068f7b7;
                  ip = ip + sVar16;
                  dst_00 = (short *)((long)dst_00 + uVar17);
                  dstCapacity_00 = dstCapacity_00 - uVar17;
                  uVar17 = uVar27 + uVar17;
                  psVar25 = &nextSeqStore;
                  psVar26 = &currSeqStore;
                  for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
                    psVar26->sequencesStart = psVar25->sequencesStart;
                    psVar25 = (seqStore_t *)((long)psVar25 + (ulong)bVar30 * -0x10 + 8);
                    psVar26 = (seqStore_t *)((long)psVar26 + (ulong)bVar30 * -0x10 + 8);
                  }
                  psVar28 = (seqDef *)((long)&psVar28->offset + 1);
                  uVar27 = uVar17;
                } while (psVar28 <= local_410);
                pZVar7 = (cctx->blockState).prevCBlock;
                pZVar7->rep[2] = dRep.rep[2];
                *(undefined8 *)pZVar7->rep = dRep.rep._0_8_;
                goto LAB_0068f7b7;
              }
            }
            uVar17 = ZSTD_compressSeqStore_singleBlock
                               (cctx,origSeqStore,&dRep,&local_440,dst,local_488,ip,uVar14,UVar9,0);
          }
LAB_0068f7b7:
          if (0xffffffffffffff88 < uVar17) {
            return uVar17;
          }
        }
      }
      else {
        sVar16 = ZSTD_buildSeqStore(cctx,ip,uVar14);
        if (0xffffffffffffff88 < sVar16) {
          return sVar16;
        }
        if (sVar16 == 0) {
          if ((((cctx->isFirstBlock != 0) ||
               (0x1f < (ulong)((long)(cctx->seqStore).sequences -
                              (long)(cctx->seqStore).sequencesStart))) ||
              (9 < (ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart))) ||
             (iVar13 = ZSTD_isRLE(ip,uVar14), iVar13 == 0)) {
            uVar17 = ZSTD_compressSuperBlock(cctx,dst,local_488,ip,uVar14,UVar9);
            if (uVar17 != 0xffffffffffffffba) {
              if (0xffffffffffffff88 < uVar17) {
                return uVar17;
              }
              ZVar5 = (cctx->appliedParams).cParams.strategy;
              bVar19 = (char)ZVar5 - 1;
              if (ZVar5 < ZSTD_btultra) {
                bVar19 = 6;
              }
              if ((uVar17 != 0) && (uVar17 < (uVar14 - (uVar14 >> (bVar19 & 0x3f))) + 1)) {
                uVar2 = (cctx->blockState).prevCBlock;
                uVar3 = (cctx->blockState).nextCBlock;
                auVar31._8_4_ = (int)uVar2;
                auVar31._0_8_ = uVar3;
                auVar31._12_4_ = (int)((ulong)uVar2 >> 0x20);
                (cctx->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
                (cctx->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar31._8_8_;
                goto LAB_0068f2ad;
              }
            }
            goto LAB_0068f269;
          }
          BVar4 = *ip;
          *(ushort *)dst = uVar11 + sVar10 * 8 + 2;
          *(char *)((long)dst + 2) = (char)(uVar14 >> 0xd);
          *(BYTE *)((long)dst + 3) = BVar4;
          uVar17 = 4;
        }
        else {
LAB_0068f269:
          uVar17 = uVar14 + 3;
          if (local_488 < uVar17) {
            return 0xffffffffffffffba;
          }
          *(ushort *)dst = uVar11 + sVar10 * 8;
          *(char *)((long)dst + 2) = (char)(uVar14 >> 0xd);
          memcpy((void *)((long)dst + 3),ip,uVar14);
          if (0xffffffffffffff88 < uVar17) {
            return uVar17;
          }
        }
LAB_0068f2ad:
        pZVar7 = (cctx->blockState).prevCBlock;
        if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
      }
      dst = (void *)((long)dst + uVar17);
      local_488 = local_488 - uVar17;
      cctx->isFirstBlock = 0;
      srcSize = srcSize - uVar14;
      ip = pBVar6;
    } while (srcSize != 0);
    if ((lastFrameChunk != 0) && (local_400 < dst)) {
      cctx->stage = ZSTDcs_ending;
    }
    uVar14 = (long)dst - (long)local_400;
    srcSize = sVar22;
  }
  if (uVar14 < 0xffffffffffffff89) {
    uVar8 = cctx->consumedSrcSize;
    cctx->consumedSrcSize = uVar8 + srcSize;
    uVar14 = uVar14 + local_408;
    cctx->producedCSize = cctx->producedCSize + uVar14;
    sVar22 = 0xffffffffffffffb8;
    if (uVar8 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
      sVar22 = uVar14;
    }
    if (cctx->pledgedSrcSizePlusOne != 0) {
      uVar14 = sVar22;
    }
  }
  return uVar14;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}